

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

PHYSFS_EnumerateCallbackResult setSaneCfgEnumCallback(void *_data,char *dir,char *f)

{
  undefined8 uVar1;
  int iVar2;
  PHYSFS_ErrorCode PVar3;
  size_t sVar4;
  char *__s;
  size_t sVar5;
  char *__s_00;
  undefined1 *puVar6;
  long lVar7;
  undefined1 *ptr;
  ulong uVar8;
  undefined1 auStack_38 [8];
  
  uVar8 = *(ulong *)((long)_data + 8);
  sVar4 = strlen(f);
  lVar7 = sVar4 - uVar8;
  puVar6 = auStack_38;
  if ((uVar8 <= sVar4 && lVar7 != 0) && (puVar6 = auStack_38, f[lVar7 + -1] == '.')) {
    iVar2 = PHYSFS_utf8stricmp(f + lVar7,*_data);
    puVar6 = auStack_38;
    if (iVar2 == 0) {
      __s = PHYSFS_getRealDir(f);
      sVar5 = strlen(__s);
      uVar8 = sVar5 + sVar4 + 2;
      if (uVar8 < 0x100) {
        ptr = auStack_38 + -(sVar5 + sVar4 + 0x19 & 0xfffffffffffffff0);
        puVar6 = ptr;
      }
      else {
        ptr = (undefined1 *)0x0;
        puVar6 = auStack_38;
      }
      *(undefined8 *)(puVar6 + -8) = 0x10839a;
      __s_00 = (char *)__PHYSFS_initSmallAlloc(ptr,uVar8);
      if (__s_00 == (char *)0x0) {
        *(undefined4 *)((long)_data + 0x14) = 2;
      }
      else {
        *(undefined8 *)(puVar6 + -8) = 0x2f;
        uVar1 = *(undefined8 *)(puVar6 + -8);
        *(undefined8 *)(puVar6 + -8) = 0x1083c0;
        snprintf(__s_00,uVar8,"%s%c%s",__s,uVar1,f);
        iVar2 = *(int *)((long)_data + 0x10);
        *(undefined8 *)(puVar6 + -8) = 0x1083d3;
        iVar2 = PHYSFS_mount(__s_00,(char *)0x0,(uint)(iVar2 == 0));
        if (iVar2 == 0) {
          *(undefined8 *)(puVar6 + -8) = 0x1083dc;
          PVar3 = currentErrorCode();
          *(PHYSFS_ErrorCode *)((long)_data + 0x14) = PVar3;
        }
        if (*(long *)(__s_00 + -8) != 0) {
          *(undefined8 *)(puVar6 + -8) = 0x1083f8;
          (*__PHYSFS_AllocatorHooks.Free)(__s_00 + -8);
        }
      }
    }
  }
  *(undefined8 *)(puVar6 + -8) = 1;
  return (PHYSFS_EnumerateCallbackResult)*(undefined8 *)(puVar6 + -8);
}

Assistant:

static PHYSFS_EnumerateCallbackResult setSaneCfgEnumCallback(void *_data,
                                                const char *dir, const char *f)
{
    setSaneCfgEnumData *data = (setSaneCfgEnumData *) _data;
    const size_t extlen = data->archiveExtLen;
    const size_t l = strlen(f);
    const char *ext;

    if ((l > extlen) && (f[l - extlen - 1] == '.'))
    {
        ext = f + (l - extlen);
        if (PHYSFS_utf8stricmp(ext, data->archiveExt) == 0)
        {
            const char dirsep = __PHYSFS_platformDirSeparator;
            const char *d = PHYSFS_getRealDir(f);
            const size_t allocsize = strlen(d) + l + 2;
            char *str = (char *) __PHYSFS_smallAlloc(allocsize);
            if (str == NULL)
                data->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
            else
            {
                snprintf(str, allocsize, "%s%c%s", d, dirsep, f);
                if (!PHYSFS_mount(str, NULL, data->archivesFirst == 0))
                    data->errcode = currentErrorCode();
                __PHYSFS_smallFree(str);
            } /* else */
        } /* if */
    } /* if */

    /* !!! FIXME: if we want to abort on errors... */
    /*return (data->errcode != PHYSFS_ERR_OK) ? PHYSFS_ENUM_ERROR : PHYSFS_ENUM_OK;*/

    return PHYSFS_ENUM_OK;  /* keep going */
}